

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

int Granulator::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(0xd) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(0xd) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Speed","%",0.001,25.0,0.01,100.0,2.5,0,
                    "The speed in samples at which the grains will be replayed relative to the original"
                   );
  RegisterParameter(definition,"Window len","%",0.001,1.0,0.1,100.0,2.5,1,
                    "Length of grain in seconds");
  RegisterParameter(definition,"Rnd speed","%",0.0,5.0,0.0,100.0,2.5,2,
                    "Randomized amount of speed in samples");
  RegisterParameter(definition,"Rnd offset","%",0.0,1.0,0.0,100.0,2.5,3,
                    "Randomized offset in seconds");
  RegisterParameter(definition,"Rnd window len","%",0.0,1.0,0.0,100.0,2.5,4,
                    "Randomized amount of grain length in seconds");
  RegisterParameter(definition,"Freeze","",0.0,1.0,0.0,1.0,1.0,5,
                    "Freeze threshold (only for live input)");
  RegisterParameter(definition,"Offset","%",0.0,1.0,0.0,100.0,1.0,6,
                    "Offset in recorded or sampled waveform");
  RegisterParameter(definition,"Rate","Hz",0.0,1000.0,0.5,1.0,2.5,7,"Grain emission rate");
  RegisterParameter(definition,"Random rate","Hz",0.0,1000.0,0.5,1.0,2.5,8,
                    "Random grain emission rate");
  RegisterParameter(definition,"Pan base","%",0.0,1.0,0.5,100.0,1.0,9,"Panning position base");
  RegisterParameter(definition,"Pan range","%",0.0,1.0,0.5,100.0,1.0,10,"Panning position range");
  RegisterParameter(definition,"Shape","%",1.0,10.0,1.0,100.0,1.0,0xb,"Grain shape (1 = triangular)"
                   );
  RegisterParameter(definition,"Use Sample","",-1.0,15.0,-1.0,1.0,1.0,0xc,
                    "-1 = use live input, otherwise indicates the slot of a sample uploaded by scripts via Granulator_UploadSample"
                   );
  return 0xd;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Speed", "%", 0.001f, 25.0f, 0.01f, 100.0f, 2.5f, P_SPEED, "The speed in samples at which the grains will be replayed relative to the original");
        RegisterParameter(definition, "Window len", "%", 0.001f, 1.0f, 0.1f, 100.0f, 2.5f, P_WLEN, "Length of grain in seconds");
        RegisterParameter(definition, "Rnd speed", "%", 0.0f, 5.0f, 0.0f, 100.0f, 2.5f, P_RSPEED, "Randomized amount of speed in samples");
        RegisterParameter(definition, "Rnd offset", "%", 0.0f, 1.0f, 0.0f, 100.0f, 2.5f, P_ROFS, "Randomized offset in seconds");
        RegisterParameter(definition, "Rnd window len", "%", 0.0f, 1.0f, 0.0f, 100.0f, 2.5f, P_RWLEN, "Randomized amount of grain length in seconds");
        RegisterParameter(definition, "Freeze", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_FREEZE, "Freeze threshold (only for live input)");
        RegisterParameter(definition, "Offset", "%", 0.0f, 1.0f, 0.0f, 100.0f, 1.0f, P_OFFSET, "Offset in recorded or sampled waveform");
        RegisterParameter(definition, "Rate", "Hz", 0.0f, 1000.0f, 0.5f, 1.0f, 2.5f, P_RATE, "Grain emission rate");
        RegisterParameter(definition, "Random rate", "Hz", 0.0f, 1000.0f, 0.5f, 1.0f, 2.5f, P_RRATE, "Random grain emission rate");
        RegisterParameter(definition, "Pan base", "%", 0.0f, 1.0f, 0.5f, 100.0f, 1.0f, P_PANBASE, "Panning position base");
        RegisterParameter(definition, "Pan range", "%", 0.0f, 1.0f, 0.5f, 100.0f, 1.0f, P_PANRANGE, "Panning position range");
        RegisterParameter(definition, "Shape", "%", 1.0f, 10.0f, 1.0f, 100.0f, 1.0f, P_SHAPE, "Grain shape (1 = triangular)");
        RegisterParameter(definition, "Use Sample", "", -1.0f, MAXSAMPLE - 1, -1.0f, 1.0f, 1.0f, P_USESAMPLE, "-1 = use live input, otherwise indicates the slot of a sample uploaded by scripts via Granulator_UploadSample");
        return numparams;
    }